

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

int glfwInit(void)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if (_glfwInitialized == 0) {
    iVar2 = 0;
    memset(&_glfw,0,0xdb8);
    iVar1 = _glfwPlatformInit();
    if (iVar1 == 0) {
      _glfwPlatformTerminate();
    }
    else {
      _glfw.monitors = _glfwPlatformGetMonitors(&_glfw.monitorCount);
      _glfwInitialized = 1;
      _glfw.timerOffset = _glfwPlatformGetTimerValue();
      glfwDefaultWindowHints();
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

GLFWAPI int glfwInit(void)
{
    if (_glfwInitialized)
        return GLFW_TRUE;

    memset(&_glfw, 0, sizeof(_glfw));

    if (!_glfwPlatformInit())
    {
        _glfwPlatformTerminate();
        return GLFW_FALSE;
    }

    _glfw.monitors = _glfwPlatformGetMonitors(&_glfw.monitorCount);
    _glfwInitialized = GLFW_TRUE;

    _glfw.timerOffset = _glfwPlatformGetTimerValue();

    // Not all window hints have zero as their default value
    glfwDefaultWindowHints();

    return GLFW_TRUE;
}